

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void * __thiscall
c4::MemoryResourceLinear::do_allocate
          (MemoryResourceLinear *this,size_t sz,size_t alignment,void *hint)

{
  code *pcVar1;
  bool bVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong local_30;
  
  if (sz == 0) {
    return (void *)0x0;
  }
  uVar4 = (this->super__MemoryResourceSingleChunk).m_size;
  uVar9 = (this->super__MemoryResourceSingleChunk).m_pos;
  if (uVar4 < uVar9 + sz) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      pcVar1 = (code *)swi(3);
      pvVar3 = (void *)(*pcVar1)();
      return pvVar3;
    }
    pcVar6 = "out of memory";
    uVar7 = 0x445a;
  }
  else {
    uVar5 = uVar4 - uVar9;
    if (sz <= uVar5) {
      pcVar6 = (this->super__MemoryResourceSingleChunk).m_mem + uVar9;
      pvVar3 = (void *)(-alignment & (ulong)(pcVar6 + (alignment - 1)));
      uVar8 = (long)pvVar3 - (long)pcVar6;
      if ((uVar8 <= uVar5 - sz) && (pvVar3 != (void *)0x0)) {
        uVar8 = uVar5 - uVar8;
        if (uVar4 < uVar9) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            pcVar1 = (code *)swi(3);
            pvVar3 = (void *)(*pcVar1)();
            return pvVar3;
          }
          handle_error(0x24bbea,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x4461,"m_pos <= m_size");
        }
        if (uVar5 < uVar8) {
          do_allocate();
          uVar4 = local_30;
        }
        uVar9 = (sz - uVar8) + uVar4;
        (this->super__MemoryResourceSingleChunk).m_pos = uVar9;
        if (uVar9 <= uVar4) {
          return pvVar3;
        }
        do_allocate();
        return pvVar3;
      }
    }
    if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      pcVar1 = (code *)swi(3);
      pvVar3 = (void *)(*pcVar1)();
      return pvVar3;
    }
    pcVar6 = "could not align memory";
    uVar7 = 0x4469;
  }
  handle_error(pcVar6,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,uVar7);
}

Assistant:

void* MemoryResourceLinear::do_allocate(size_t sz, size_t alignment, void *hint)
{
    C4_UNUSED(hint);
    if(sz == 0) return nullptr;
    // make sure there's enough room to allocate
    if(m_pos + sz > m_size)
    {
        C4_ERROR("out of memory");
        return nullptr;
    }
    void *mem = m_mem + m_pos;
    size_t space = m_size - m_pos;
    if(std::align(alignment, sz, mem, space))
    {
        C4_ASSERT(m_pos <= m_size);
        C4_ASSERT(m_size - m_pos >= space);
        m_pos += (m_size - m_pos) - space;
        m_pos += sz;
        C4_ASSERT(m_pos <= m_size);
    }
    else
    {
        C4_ERROR("could not align memory");
        mem = nullptr;
    }
    return mem;
}